

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::print_to_file
          (Persistence_landscape *this,char *filename)

{
  size_type sVar1;
  ostream *poVar2;
  void *pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  size_type local_238;
  size_t i;
  size_t dim;
  ostream local_218 [8];
  ofstream write;
  char *filename_local;
  Persistence_landscape *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  i = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ::size(&this->land);
    if (i == sVar1) break;
    poVar2 = std::operator<<(local_218,"#lambda_");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,i);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_238 = 1;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,i);
      sVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar4);
      if (local_238 == sVar1 - 1) break;
      pvVar4 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,i);
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar4,local_238);
      poVar2 = (ostream *)std::ostream::operator<<(local_218,pvVar5->first);
      poVar2 = std::operator<<(poVar2,"  ");
      pvVar4 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,i);
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar4,local_238);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar5->second);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      local_238 = local_238 + 1;
    }
    i = i + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Persistence_landscape::print_to_file(const char* filename) const {
  std::ofstream write;
  write.open(filename);
  for (size_t dim = 0; dim != this->land.size(); ++dim) {
    write << "#lambda_" << dim << std::endl;
    for (size_t i = 1; i != this->land[dim].size() - 1; ++i) {
      write << this->land[dim][i].first << "  " << this->land[dim][i].second << std::endl;
    }
  }
  write.close();
}